

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O0

void dpfb::readGposPairAdjustment(Stream *stream,LookupContext *ctx)

{
  StreamError *this;
  string local_40 [38];
  uint16_t local_1a;
  LookupContext *pLStack_18;
  uint16_t posFormat;
  LookupContext *ctx_local;
  Stream *stream_local;
  
  pLStack_18 = ctx;
  ctx_local = (LookupContext *)stream;
  local_1a = streams::Stream::readU16Be(stream);
  if (local_1a == 1) {
    readGposPairAdjustmentFormat1((Stream *)ctx_local,pLStack_18);
  }
  else {
    if (local_1a != 2) {
      this = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                ((char *)local_40,"Unknown format of \"GPOS\" pair adjustment subtable: %u",
                 (ulong)local_1a);
      streams::StreamError::runtime_error(this,local_40);
      __cxa_throw(this,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
    }
    readGposPairAdjustmentFormat2((Stream *)ctx_local,pLStack_18);
  }
  return;
}

Assistant:

static void readGposPairAdjustment(Stream& stream, LookupContext& ctx)
{
    const auto posFormat = stream.readU16Be();
    if (posFormat == 1)
        readGposPairAdjustmentFormat1(stream, ctx);
    else if (posFormat == 2)
        readGposPairAdjustmentFormat2(stream, ctx);
    else
        throw StreamError(str::format(
            "Unknown format of \"GPOS\" pair adjustment subtable: "
            "%" PRIu16,
            posFormat));
}